

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

NodeData __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::DFS(SCCAnalyzer *this,Descriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
  *this_00;
  pointer *pppDVar2;
  iterator iVar3;
  int iVar4;
  _Base_ptr p_Var5;
  LogMessage *other;
  mapped_type *pmVar6;
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
  *this_01;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  int iVar9;
  long lVar10;
  NodeData NVar11;
  Descriptor *child;
  LogFinisher local_71;
  Descriptor *local_70;
  LogMessage local_68;
  
  p_Var5 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = &p_Var1->_M_header;
  local_70 = descriptor;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      if (*(Descriptor **)(p_Var5 + 1) >= descriptor) {
        p_Var8 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(Descriptor **)(p_Var5 + 1) < descriptor];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 != p_Var1) && (*(Descriptor **)(p_Var8 + 1) <= descriptor)) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
                 ,0x29b);
      other = internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (cache_.count(descriptor)) == (0): ");
      internal::LogFinisher::operator=(&local_71,other);
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  this_00 = &this->cache_;
  pmVar6 = std::
           map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
           ::operator[](this_00,&local_70);
  iVar4 = this->index_;
  this->index_ = iVar4 + 1;
  pmVar6->lowlink = iVar4;
  pmVar6->index = iVar4;
  iVar3._M_current =
       (this->stack_).
       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->stack_).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
    ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
              ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                *)&this->stack_,iVar3,&local_70);
  }
  else {
    *iVar3._M_current = local_70;
    pppDVar2 = &(this->stack_).
                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar2 = *pppDVar2 + 1;
  }
  if (0 < *(int *)(local_70 + 0x2c)) {
    lVar10 = 0;
    do {
      local_68._0_8_ =
           FieldDescriptor::message_type
                     ((FieldDescriptor *)(lVar10 * 0xa8 + *(long *)(local_70 + 0x30)));
      if ((Descriptor *)local_68._0_8_ != (Descriptor *)0x0) {
        p_Var5 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var1->_M_header;
        if (p_Var5 == (_Base_ptr)0x0) {
LAB_0020f747:
          NVar11 = DFS(this,(Descriptor *)local_68._0_8_);
          iVar9 = NVar11.lowlink;
          iVar4 = pmVar6->lowlink;
        }
        else {
          do {
            if (*(Descriptor **)(p_Var5 + 1) >= (ulong)local_68._0_8_) {
              p_Var8 = p_Var5;
            }
            p_Var5 = (&p_Var5->_M_left)[*(Descriptor **)(p_Var5 + 1) < (ulong)local_68._0_8_];
          } while (p_Var5 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var8 == p_Var1) ||
             ((ulong)local_68._0_8_ < (Descriptor *)((_Rb_tree_header *)p_Var8)->_M_node_count))
          goto LAB_0020f747;
          pmVar7 = std::
                   map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
                   ::operator[](this_00,(key_type *)&local_68);
          if (pmVar7->scc != (SCC *)0x0) goto LAB_0020f763;
          iVar4 = pmVar7->index;
          iVar9 = pmVar6->lowlink;
        }
        if (iVar4 < iVar9) {
          iVar9 = iVar4;
        }
        pmVar6->lowlink = iVar9;
      }
LAB_0020f763:
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(local_70 + 0x2c));
  }
  if (pmVar6->index == pmVar6->lowlink) {
    this_01 = (vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
               *)CreateSCC(this);
    do {
      local_68._0_8_ =
           (this->stack_).
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
      iVar3._M_current = *(Descriptor ***)(this_01 + 8);
      if (iVar3._M_current == *(Descriptor ***)(this_01 + 0x10)) {
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                  (this_01,iVar3,(Descriptor **)&local_68);
      }
      else {
        *iVar3._M_current = (Descriptor *)local_68._0_8_;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      pppDVar2 = &(this->stack_).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar2 = *pppDVar2 + -1;
      pmVar7 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
               ::operator[](this_00,(key_type *)&local_68);
      pmVar7->scc = (SCC *)this_01;
    } while ((Descriptor *)local_68._0_8_ != local_70);
  }
  NVar11.scc = pmVar6->scc;
  NVar11.index = pmVar6->index;
  NVar11.lowlink = pmVar6->lowlink;
  return NVar11;
}

Assistant:

SCCAnalyzer::NodeData SCCAnalyzer::DFS(const Descriptor* descriptor) {
  // Must not have visited already.
  GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

  // Mark visited by inserting in map.
  NodeData& result = cache_[descriptor];
  // Initialize data structures.
  result.index = result.lowlink = index_++;
  stack_.push_back(descriptor);

  // Recurse the fields / nodes in graph
  for (int i = 0; i < descriptor->field_count(); i++) {
    const Descriptor* child = descriptor->field(i)->message_type();
    if (child) {
      if (cache_.count(child) == 0) {
        // unexplored node
        NodeData child_data = DFS(child);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[child];
        if (child_data.scc == NULL) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
  }
  if (result.index == result.lowlink) {
    // This is the root of a strongly connected component
    SCC* scc = CreateSCC();
    while (true) {
      const Descriptor* scc_desc = stack_.back();
      scc->descriptors.push_back(scc_desc);
      // Remove from stack
      stack_.pop_back();
      cache_[scc_desc].scc = scc;

      if (scc_desc == descriptor) break;
    }
  }
  return result;
}